

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O2

shared_ptr<chaiscript::detail::Type_Conversion_Base> __thiscall
chaiscript::Type_Conversions::get_conversion(Type_Conversions *this,Type_Info *to,Type_Info *from)

{
  const_iterator cVar1;
  out_of_range *this_00;
  char *pcVar2;
  Type_Info *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> sVar3;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  cVar1 = find((Type_Conversions *)to,from,in_RCX);
  if (cVar1._M_node != (_Base_ptr)&to->m_flags) {
    std::__shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr((__shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>
                  *)this,(__shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>
                          *)(cVar1._M_node + 1));
    sVar3.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    sVar3.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (shared_ptr<chaiscript::detail::Type_Conversion_Base>)
           sVar3.
           super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"No such conversion exists from ",&local_a9);
  pcVar2 = Type_Info::bare_name(in_RCX);
  std::operator+(&local_88,&local_a8,pcVar2);
  std::operator+(&local_68,&local_88," to ");
  pcVar2 = Type_Info::bare_name(from);
  std::operator+(&local_48,&local_68,pcVar2);
  std::out_of_range::out_of_range(this_00,(string *)&local_48);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

std::shared_ptr<detail::Type_Conversion_Base> get_conversion(const Type_Info &to, const Type_Info &from) const {
      chaiscript::detail::threading::shared_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);

      const auto itr = find(to, from);

      if (itr != m_conversions.end()) {
        return *itr;
      } else {
        throw std::out_of_range(std::string("No such conversion exists from ") + from.bare_name() + " to " + to.bare_name());
      }
    }